

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

void * probe_access_arm(CPUArchState_conflict *env,target_ulong_conflict addr,int size,
                       MMUAccessType access_type,int mmu_idx,uintptr_t retaddr)

{
  uint uVar1;
  int flags;
  TargetPageBits *pTVar2;
  byte bVar3;
  _Bool _Var4;
  void *pvVar5;
  size_t mmu_idx_00;
  long lVar6;
  CPUARMState *__mptr_1;
  ulong uVar7;
  long lVar8;
  ulong index;
  CPUIOTLBEntry *iotlbentry;
  uint uVar9;
  CPUARMState *__mptr;
  
  pTVar2 = env->uc->init_target_page;
  bVar3 = (byte)pTVar2->bits & 0x1f;
  uVar1 = pTVar2->mask;
  if (-(uVar1 | addr) < (uint)size) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
               ,0x4ab,"-(addr | TARGET_PAGE_MASK) >= size");
  }
  if (MMU_INST_FETCH < access_type) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
               ,0x4bc,(char *)(ulong)(0 >> bVar3));
  }
  mmu_idx_00 = (size_t)mmu_idx;
  lVar6 = mmu_idx_00 * 0x10;
  index = (ulong)((uint)(*(ulong *)((long)env + lVar6 + -0xd0) >> 6) & addr >> bVar3);
  lVar8 = *(long *)((long)env + lVar6 + -200) + index * 0x40;
  uVar7 = (ulong)access_type;
  flags = *(int *)(&DAT_00d70a98 + uVar7 * 4);
  uVar9 = *(uint *)(lVar8 + uVar7 * 4);
  if (((uVar1 | 0x200) & uVar9) != (uVar1 & addr)) {
    _Var4 = victim_tlb_hit(env,mmu_idx_00,index,uVar7 * 4,uVar1 & addr);
    if (!_Var4) {
      tlb_fill((CPUState *)(env[-10].cp15.c14_pmevcntr + 0x1b),addr,size,access_type,mmu_idx,retaddr
              );
      index = (ulong)((uint)(*(ulong *)((long)env + lVar6 + -0xd0) >> 6) &
                     addr >> ((byte)env->uc->init_target_page->bits & 0x1f));
      lVar8 = index * 0x40 + *(long *)((long)env + lVar6 + -200);
    }
    uVar9 = *(uint *)(lVar8 + uVar7 * 4);
  }
  uVar7 = (ulong)addr;
  if (size == 0) {
LAB_005767c3:
    pvVar5 = (void *)0x0;
  }
  else {
    if ((uVar9 & 0x3f0) != 0) {
      if ((uVar9 & 0xb0) != 0) goto LAB_005767c3;
      iotlbentry = (CPUIOTLBEntry *)
                   (index * 0x10 + *(long *)((long)env + mmu_idx_00 * 0x2b0 + -0x1e68));
      if ((uVar9 & 0x40) != 0) {
        cpu_check_watchpoint_arm
                  ((CPUState *)(env[-10].cp15.c14_pmevcntr + 0x1b),uVar7,(long)size,
                   iotlbentry->attrs,flags,retaddr);
      }
      if ((uVar9 >> 8 & 1) != 0) {
        notdirty_write((CPUState *)(env[-10].cp15.c14_pmevcntr + 0x1b),uVar7,size,iotlbentry,retaddr
                      );
      }
    }
    pvVar5 = (void *)(*(long *)(lVar8 + 0x10) + uVar7);
  }
  return pvVar5;
}

Assistant:

void *probe_access(CPUArchState *env, target_ulong addr, int size,
                   MMUAccessType access_type, int mmu_idx, uintptr_t retaddr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = env->uc;
#endif
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr;
    size_t elt_ofs = 0;
    int wp_access = 0;

#ifdef _MSC_VER
    g_assert(((target_ulong)0 - (addr | TARGET_PAGE_MASK)) >= size);
#else
    g_assert(-(addr | TARGET_PAGE_MASK) >= size);
#endif

    switch (access_type) {
    case MMU_DATA_LOAD:
        elt_ofs = offsetof(CPUTLBEntry, addr_read);
        wp_access = BP_MEM_READ;
        break;
    case MMU_DATA_STORE:
        elt_ofs = offsetof(CPUTLBEntry, addr_write);
        wp_access = BP_MEM_WRITE;
        break;
    case MMU_INST_FETCH:
        elt_ofs = offsetof(CPUTLBEntry, addr_code);
        wp_access = BP_MEM_READ;
        break;
    default:
        g_assert_not_reached();
    }
    tlb_addr = tlb_read_ofs(entry, elt_ofs);

    if (unlikely(!tlb_hit(env->uc, tlb_addr, addr))) {
        if (!victim_tlb_hit(env, mmu_idx, index, elt_ofs,
                            addr & TARGET_PAGE_MASK)) {
            tlb_fill(env_cpu(env), addr, size, access_type, mmu_idx, retaddr);
            /* TLB resize via tlb_fill may have moved the entry. */
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_read_ofs(entry, elt_ofs);
    }

    if (!size) {
        return NULL;
    }

    if (unlikely(tlb_addr & TLB_FLAGS_MASK)) {
        CPUIOTLBEntry *iotlbentry = &env_tlb(env)->d[mmu_idx].iotlb[index];

        /* Reject I/O access, or other required slow-path.  */
        if (tlb_addr & (TLB_MMIO | TLB_BSWAP | TLB_DISCARD_WRITE)) {
            return NULL;
        }

        /* Handle watchpoints.  */
        if (tlb_addr & TLB_WATCHPOINT) {
            cpu_check_watchpoint(env_cpu(env), addr, size,
                                 iotlbentry->attrs, wp_access, retaddr);
        }

        /* Handle clean RAM pages.  */
        if (tlb_addr & TLB_NOTDIRTY) {
            notdirty_write(env_cpu(env), addr, size, iotlbentry, retaddr);
        }
    }

    return (void *)((uintptr_t)addr + entry->addend);
}